

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_q6_K(block_q6_K *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  int l;
  ulong uVar8;
  block_q6_K *pbVar9;
  uint8_t *puVar10;
  int8_t *piVar11;
  bool bVar12;
  ulong uVar13;
  
  lVar6 = k + 0xff;
  if (-1 < k) {
    lVar6 = k;
  }
  if (0xff < k) {
    lVar7 = 0;
    do {
      pbVar9 = x + lVar7;
      puVar10 = x[lVar7].qh;
      fVar1 = ggml_table_f32_f16[x[lVar7].d];
      piVar11 = x[lVar7].scales;
      bVar5 = true;
      do {
        bVar12 = bVar5;
        uVar8 = 0;
        do {
          uVar13 = uVar8 >> 4 & 0xfffffff;
          bVar2 = pbVar9->ql[uVar8];
          bVar3 = pbVar9->ql[uVar8 + 0x20];
          bVar4 = puVar10[uVar8];
          y[uVar8] = (float)(int)(char)(((bVar4 & 3) << 4 | bVar2 & 0xf) - 0x20) *
                     (float)(int)piVar11[uVar13] * fVar1;
          y[uVar8 + 0x20] =
               (float)(int)(char)((bVar4 * '\x04' & 0x30 | bVar3 & 0xf) - 0x20) *
               (float)(int)piVar11[uVar13 + 2] * fVar1;
          y[uVar8 + 0x40] =
               (float)(int)(char)((bVar4 & 0x30 | bVar2 >> 4) - 0x20) *
               (float)(int)piVar11[uVar13 + 4] * fVar1;
          y[uVar8 + 0x60] =
               (float)(int)(char)((bVar4 >> 2 & 0x30 | bVar3 >> 4) - 0x20) *
               (float)(int)piVar11[uVar13 + 6] * fVar1;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x20);
        y = y + 0x80;
        pbVar9 = (block_q6_K *)(pbVar9->ql + 0x40);
        puVar10 = puVar10 + 0x20;
        piVar11 = piVar11 + 8;
        bVar5 = false;
      } while (bVar12);
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_q6_K(const block_q6_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT ql = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT sc = x[i].scales;

        for (int n = 0; n < QK_K; n += 128) {
            for (int l = 0; l < 32; ++l) {
                int is = l/16;
                const int8_t q1 = (int8_t)((ql[l +  0] & 0xF) | (((qh[l] >> 0) & 3) << 4)) - 32;
                const int8_t q2 = (int8_t)((ql[l + 32] & 0xF) | (((qh[l] >> 2) & 3) << 4)) - 32;
                const int8_t q3 = (int8_t)((ql[l +  0]  >> 4) | (((qh[l] >> 4) & 3) << 4)) - 32;
                const int8_t q4 = (int8_t)((ql[l + 32]  >> 4) | (((qh[l] >> 6) & 3) << 4)) - 32;
                y[l +  0] = d * sc[is + 0] * q1;
                y[l + 32] = d * sc[is + 2] * q2;
                y[l + 64] = d * sc[is + 4] * q3;
                y[l + 96] = d * sc[is + 6] * q4;
            }
            y  += 128;
            ql += 64;
            qh += 32;
            sc += 8;
        }
    }
}